

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<kj::OwnFd>::setCapacity(Vector<kj::OwnFd> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::OwnFd> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::OwnFd> newBuilder;
  size_t newSize_local;
  Vector<kj::OwnFd> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::OwnFd>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::OwnFd>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::OwnFd>((ArrayBuilder<kj::OwnFd> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::OwnFd>>(&this->builder);
  ArrayBuilder<kj::OwnFd>::addAll<kj::ArrayBuilder<kj::OwnFd>>
            ((ArrayBuilder<kj::OwnFd> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::OwnFd>>((ArrayBuilder<kj::OwnFd> *)local_38);
  ArrayBuilder<kj::OwnFd>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::OwnFd>::~ArrayBuilder((ArrayBuilder<kj::OwnFd> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }